

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O2

SimpleString __thiscall
TestFailure::createDifferenceAtPosString
          (TestFailure *this,SimpleString *actual,size_t position,DifferenceFormat format)

{
  size_t i;
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  undefined4 in_register_0000000c;
  int in_R8D;
  SimpleString result;
  SimpleString markString;
  SimpleString differentString;
  SimpleString actualString;
  SimpleString paddingForPreventingOutOfBounds;
  SimpleString local_38;
  
  sVar4 = CONCAT44(in_register_0000000c,format);
  SimpleString::SimpleString((SimpleString *)this,"");
  sVar3 = sVar4 * 3 + 1;
  if (in_R8D == 0) {
    sVar3 = sVar4;
  }
  SimpleString::SimpleString(&paddingForPreventingOutOfBounds," ",10);
  SimpleString::operator+(&differentString,&paddingForPreventingOutOfBounds);
  SimpleString::operator+(&actualString,&differentString);
  SimpleString::~SimpleString(&differentString);
  StringFromFormat((char *)&differentString,"difference starts at position %lu at: <",sVar4);
  SimpleString::operator+=((SimpleString *)this,"\n");
  pcVar1 = SimpleString::asCharString(&differentString);
  SimpleString::subString(&result,(size_t)&actualString,sVar3);
  pcVar2 = SimpleString::asCharString(&result);
  StringFromFormat((char *)&markString,"\t%s%s>\n",pcVar1,pcVar2);
  SimpleString::operator+=((SimpleString *)this,&markString);
  SimpleString::~SimpleString(&markString);
  SimpleString::~SimpleString(&result);
  SimpleString::subString(&markString,(size_t)&actualString,sVar3);
  sVar3 = SimpleString::size(&markString);
  pcVar1 = (char *)(*PlatformSpecificMalloc)(sVar3 + 1);
  SimpleString::copyToBuffer(&markString,pcVar1,sVar3 + 1);
  for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
    if (1 < (byte)(pcVar1[sVar4] - 9U)) {
      pcVar1[sVar4] = ' ';
    }
  }
  SimpleString::SimpleString(&result,pcVar1);
  (*PlatformSpecificFree)(pcVar1);
  SimpleString::operator=(&markString,&result);
  SimpleString::~SimpleString(&result);
  sVar3 = SimpleString::size(&markString);
  pcVar1 = (char *)(*PlatformSpecificMalloc)(sVar3 + 1);
  SimpleString::copyToBuffer(&markString,pcVar1,sVar3 + 1);
  pcVar1[10] = '^';
  SimpleString::SimpleString(&result,pcVar1);
  (*PlatformSpecificFree)(pcVar1);
  SimpleString::operator=(&markString,&result);
  SimpleString::~SimpleString(&result);
  sVar3 = SimpleString::size(&differentString);
  SimpleString::SimpleString(&local_38," ",sVar3);
  pcVar1 = SimpleString::asCharString(&local_38);
  pcVar2 = SimpleString::asCharString(&markString);
  StringFromFormat((char *)&result,"\t%s%s",pcVar1,pcVar2);
  SimpleString::operator+=((SimpleString *)this,&result);
  SimpleString::~SimpleString(&result);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&markString);
  SimpleString::~SimpleString(&differentString);
  SimpleString::~SimpleString(&actualString);
  SimpleString::~SimpleString(&paddingForPreventingOutOfBounds);
  return (SimpleString)(char *)this;
}

Assistant:

SimpleString TestFailure::createDifferenceAtPosString(const SimpleString& actual, size_t position, DifferenceFormat format)
{
    SimpleString result;
    const size_t extraCharactersWindow = 20;
    const size_t halfOfExtraCharactersWindow = extraCharactersWindow / 2;
    const size_t actualOffset = (format == DIFFERENCE_STRING) ? position : (position * 3 + 1);

    SimpleString paddingForPreventingOutOfBounds (" ", halfOfExtraCharactersWindow);
    SimpleString actualString = paddingForPreventingOutOfBounds + actual + paddingForPreventingOutOfBounds;
    SimpleString differentString = StringFromFormat("difference starts at position %lu at: <", (unsigned long) position);

    result += "\n";
    result += StringFromFormat("\t%s%s>\n", differentString.asCharString(), actualString.subString(actualOffset, extraCharactersWindow).asCharString());

    SimpleString markString = actualString.subString(actualOffset, halfOfExtraCharactersWindow+1);
    markString = removeAllPrintableCharactersFrom(markString);
    markString = addMarkerToString(markString, halfOfExtraCharactersWindow);

    result += StringFromFormat("\t%s%s", SimpleString(" ", differentString.size()).asCharString(), markString.asCharString());
    return result;
}